

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
Well<unsigned_int,32ul,16ul,0ul,13ul,9ul,5ul,Detail::M3<-16>,Detail::M3<-15>,Detail::M3<11>,Detail::M0,Detail::M3<-2>,Detail::M3<-18>,Detail::M2<-28>,Detail::M5<-5,3661901092u>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,16ul,0ul,13ul,9ul,5ul,Detail::M3<_16>,Detail::M3<_15>,Detail::M3<11>,Detail::M0,Detail::M3<_2>,Detail::M3<_18>,Detail::M2<_28>,Detail::M5<_5,3661901092u>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  invalid_argument *this_00;
  bool bVar1;
  long local_28;
  size_t i;
  uint *last_local;
  uint **first_local;
  Well<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_Detail::M3<_16>,_Detail::M3<_15>,_Detail::M3<11>,_Detail::M0,_Detail::M3<_2>,_Detail::M3<_18>,_Detail::M2<_28>,_Detail::M5<_5,_3661901092U>,_Detail::NoTempering>
  *this_local;
  
  *(undefined8 *)(this + 0x40) = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0x10) {
      bVar1 = *first != last;
    }
    if (!bVar1) break;
    *(uint *)(this + local_28 * 4) = **first;
    local_28 = local_28 + 1;
    *first = *first + 1;
  }
  if ((*first == last) && (local_28 != 0x10)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }